

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O2

void __thiscall
xmrig::MinerPrivate::getHashrate(MinerPrivate *this,Value *reply,Document *doc,int version)

{
  Hashrate *this_00;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  int iVar1;
  pointer ppIVar2;
  undefined4 extraout_var;
  size_t i;
  ulong threadId;
  double dVar3;
  Value thread;
  Value total;
  Value hashrate;
  Value threads;
  Data local_118;
  double local_108;
  double local_100;
  double local_f8;
  int local_ec;
  Data local_e8;
  Data local_d8;
  Value *local_c8;
  MinerPrivate *local_c0;
  pointer local_b8;
  double local_b0;
  double local_a8;
  pointer local_a0;
  StringRefType local_98;
  Data local_88;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50 [2];
  Hashrate *this_01;
  
  allocator = doc->allocator_;
  local_d8.n = (Number)0x0;
  local_d8.s.str = (Ch *)0x3000000000000;
  local_e8.n = (Number)0x0;
  local_e8.s.str = (Ch *)0x4000000000000;
  local_88.n = (Number)0x0;
  local_88.s.str = (Ch *)0x4000000000000;
  ppIVar2 = (this->backends).
            super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_b8 = (this->backends).
             super__Vector_base<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_f8 = 0.0;
  this_00 = (Hashrate *)(local_50 + 1);
  local_100 = 0.0;
  local_108 = 0.0;
  local_ec = version;
  local_c8 = reply;
  local_c0 = this;
  while (ppIVar2 != local_b8) {
    local_a0 = ppIVar2;
    iVar1 = (*(*ppIVar2)->_vptr_IBackend[4])();
    this_01 = (Hashrate *)CONCAT44(extraout_var,iVar1);
    if (this_01 != (Hashrate *)0x0) {
      local_a8 = Hashrate::calc(this_01,10000);
      local_b0 = Hashrate::calc(this_01,60000);
      dVar3 = Hashrate::calc(this_01,900000);
      local_108 = local_108 + local_a8;
      local_100 = local_100 + local_b0;
      local_f8 = local_f8 + dVar3;
      if (version < 2) {
        for (threadId = 0; version = local_ec, threadId < this_01->m_threads;
            threadId = threadId + 1) {
          local_118.n.i64 = (Number)0x0;
          local_118.s.str = (Ch *)0x4000000000000;
          dVar3 = Hashrate::calc(this_01,threadId,10000);
          Hashrate::normalize(this_00,dVar3);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_118.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)this_00,allocator);
          dVar3 = Hashrate::calc(this_01,threadId,60000);
          Hashrate::normalize(this_00,dVar3);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_118.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)this_00,allocator);
          dVar3 = Hashrate::calc(this_01,threadId,900000);
          Hashrate::normalize(this_00,dVar3);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_118.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)this_00,allocator);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_88.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_118.s,allocator);
        }
      }
    }
    ppIVar2 = local_a0 + 1;
  }
  Hashrate::normalize((Hashrate *)&local_118.s,local_108);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_e8.s,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_118.s,allocator);
  Hashrate::normalize((Hashrate *)&local_118.s,local_100);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_e8.s,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_118.s,allocator);
  Hashrate::normalize((Hashrate *)&local_118.s,local_f8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_e8.s,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)&local_118.s,allocator);
  local_50[0].s = "total";
  local_50[0].length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,local_50,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_e8.s,allocator);
  local_98.s = "highest";
  local_98.length = 7;
  Hashrate::normalize((Hashrate *)&local_118.s,local_c0->maxHashrate);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,&local_98,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_118.s,allocator);
  if (version == 1) {
    local_60.s = "threads";
    local_60.length = 7;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_d8.s,&local_60,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_88.s,allocator);
  }
  local_70.s = "hashrate";
  local_70.length = 8;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(local_c8,&local_70,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_d8.s,allocator);
  return;
}

Assistant:

void getHashrate(rapidjson::Value &reply, rapidjson::Document &doc, int version) const
    {
        using namespace rapidjson;
        auto &allocator = doc.GetAllocator();

        Value hashrate(kObjectType);
        Value total(kArrayType);
        Value threads(kArrayType);

        double t[3] = { 0.0 };

        for (IBackend *backend : backends) {
            const Hashrate *hr = backend->hashrate();
            if (!hr) {
                continue;
            }

            t[0] += hr->calc(Hashrate::ShortInterval);
            t[1] += hr->calc(Hashrate::MediumInterval);
            t[2] += hr->calc(Hashrate::LargeInterval);

            if (version > 1) {
                continue;
            }

            for (size_t i = 0; i < hr->threads(); i++) {
                Value thread(kArrayType);
                thread.PushBack(Hashrate::normalize(hr->calc(i, Hashrate::ShortInterval)),  allocator);
                thread.PushBack(Hashrate::normalize(hr->calc(i, Hashrate::MediumInterval)), allocator);
                thread.PushBack(Hashrate::normalize(hr->calc(i, Hashrate::LargeInterval)),  allocator);

                threads.PushBack(thread, allocator);
            }
        }

        total.PushBack(Hashrate::normalize(t[0]),  allocator);
        total.PushBack(Hashrate::normalize(t[1]), allocator);
        total.PushBack(Hashrate::normalize(t[2]),  allocator);

        hashrate.AddMember("total",   total, allocator);
        hashrate.AddMember("highest", Hashrate::normalize(maxHashrate), allocator);

        if (version == 1) {
            hashrate.AddMember("threads", threads, allocator);
        }

        reply.AddMember("hashrate", hashrate, allocator);
    }